

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraDasmFPU_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::dasmFRestore<(moira::Instr)197,(moira::Mode)2,2>
          (Moira *this,StrWriter *str,u32 *addr,u16 op)

{
  int iVar1;
  char *pcVar2;
  char cVar3;
  long lVar4;
  Ea<(moira::Mode)2,_2> result;
  u32 local_14;
  ushort local_10;
  
  cVar3 = 'f';
  lVar4 = 0;
  do {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = cVar3;
    cVar3 = "frestore"[lVar4 + 1];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  if ((str->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar2 = str->ptr;
    str->ptr = pcVar2 + 1;
    *pcVar2 = ' ';
  }
  else {
    iVar1 = (str->tab).raw;
    do {
      pcVar2 = str->ptr;
      str->ptr = pcVar2 + 1;
      *pcVar2 = ' ';
    } while (str->ptr < str->base + iVar1);
  }
  local_10 = op & 7;
  local_14 = *addr;
  StrWriter::operator<<(str,(Ea<(moira::Mode)2,_2> *)&local_14);
  return;
}

Assistant:

void
Moira::dasmFRestore(StrWriter &str, u32 &addr, u16 op) const
{
    auto dn = _____________xxx (op);

    str << Ins<I>{} << str.tab << Op<M, S>(dn, addr);
}